

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filepath_tests.cpp
# Opt level: O0

void __thiscall
test::iu_FilePath_x_iutest_x_RemoveExtension_Test::Body
          (iu_FilePath_x_iutest_x_RemoveExtension_Test *this)

{
  bool bVar1;
  char *pcVar2;
  iuFilePath *in_R9;
  AssertionHelper local_1080;
  Fixed local_1050;
  iuFilePath local_ec8;
  undefined1 local_ea8 [8];
  AssertionResult iutest_ar_7;
  Fixed local_e50;
  iuFilePath local_cc8;
  undefined1 local_ca8 [8];
  AssertionResult iutest_ar_6;
  FilePath path_2;
  Fixed local_c30;
  iuFilePath local_aa8;
  undefined1 local_a88 [8];
  AssertionResult iutest_ar_5;
  Fixed local_a30;
  iuFilePath local_8a8;
  undefined1 local_888 [8];
  AssertionResult iutest_ar_4;
  Fixed local_830;
  iuFilePath local_6a8;
  undefined1 local_688 [8];
  AssertionResult iutest_ar_3;
  FilePath path_1;
  Fixed local_610;
  iuFilePath local_488;
  undefined1 local_468 [8];
  AssertionResult iutest_ar_2;
  Fixed local_410;
  iuFilePath local_288;
  undefined1 local_268 [8];
  AssertionResult iutest_ar_1;
  Fixed local_210;
  iuFilePath local_88;
  undefined1 local_68 [8];
  AssertionResult iutest_ar;
  undefined1 local_30 [8];
  FilePath path;
  iu_FilePath_x_iutest_x_RemoveExtension_Test *this_local;
  
  path.m_path.field_2._8_8_ = this;
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)local_30,"test.exe");
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::RemoveExtension(&local_88,(iuFilePath *)local_30,"bin");
  iutest::internal::backward::EqHelper<false>::Compare<char[9],iutest::detail::iuFilePath>
            ((AssertionResult *)local_68,(EqHelper<false> *)"\"test.exe\"",
             "path.RemoveExtension(\"bin\")","test.exe",(char (*) [9])&local_88,in_R9);
  iutest::detail::iuFilePath::~iuFilePath(&local_88);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    memset(&local_210,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_210);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_68);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xa8,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_210);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_210);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::RemoveExtension(&local_288,(iuFilePath *)local_30,"exe");
  iutest::internal::backward::EqHelper<false>::Compare<char[5],iutest::detail::iuFilePath>
            ((AssertionResult *)local_268,(EqHelper<false> *)0x54fbf6,
             "path.RemoveExtension(\"exe\")","test",(char (*) [5])&local_288,in_R9);
  iutest::detail::iuFilePath::~iuFilePath(&local_288);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    memset(&local_410,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_410);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_268);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xa9,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_410);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_410);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::RemoveExtension(&local_488,(iuFilePath *)local_30,(char *)0x0);
  iutest::internal::backward::EqHelper<false>::Compare<char[5],iutest::detail::iuFilePath>
            ((AssertionResult *)local_468,(EqHelper<false> *)0x54fbf6,"path.RemoveExtension()",
             "test",(char (*) [5])&local_488,in_R9);
  iutest::detail::iuFilePath::~iuFilePath(&local_488);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar1) {
    memset(&local_610,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_610);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_468);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)((long)&path_1.m_path.field_2 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xab,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)((long)&path_1.m_path.field_2 + 8),&local_610);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)((long)&path_1.m_path.field_2 + 8))
    ;
    iutest::AssertionHelper::Fixed::~Fixed(&local_610);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)local_30);
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)&iutest_ar_3.m_result,"test.exe.bin");
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::RemoveExtension(&local_6a8,(iuFilePath *)&iutest_ar_3.m_result,"bin");
  iutest::internal::backward::EqHelper<false>::Compare<char[9],iutest::detail::iuFilePath>
            ((AssertionResult *)local_688,(EqHelper<false> *)"\"test.exe\"",
             "path.RemoveExtension(\"bin\")","test.exe",(char (*) [9])&local_6a8,in_R9);
  iutest::detail::iuFilePath::~iuFilePath(&local_6a8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_688);
  if (!bVar1) {
    memset(&local_830,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_830);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_688);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xb0,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_830);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_830);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_688);
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::RemoveExtension(&local_8a8,(iuFilePath *)&iutest_ar_3.m_result,"exe");
  iutest::internal::backward::EqHelper<false>::Compare<char[13],iutest::detail::iuFilePath>
            ((AssertionResult *)local_888,(EqHelper<false> *)"\"test.exe.bin\"",
             "path.RemoveExtension(\"exe\")","test.exe.bin",(char (*) [13])&local_8a8,in_R9);
  iutest::detail::iuFilePath::~iuFilePath(&local_8a8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_888);
  if (!bVar1) {
    memset(&local_a30,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_a30);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_888);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xb1,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_a30);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_a30);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_888);
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::RemoveExtension
            (&local_aa8,(iuFilePath *)&iutest_ar_3.m_result,(char *)0x0);
  iutest::internal::backward::EqHelper<false>::Compare<char[9],iutest::detail::iuFilePath>
            ((AssertionResult *)local_a88,(EqHelper<false> *)"\"test.exe\"","path.RemoveExtension()"
             ,"test.exe",(char (*) [9])&local_aa8,in_R9);
  iutest::detail::iuFilePath::~iuFilePath(&local_aa8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a88);
  if (!bVar1) {
    memset(&local_c30,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_c30);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_a88);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)((long)&path_2.m_path.field_2 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xb3,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)((long)&path_2.m_path.field_2 + 8),&local_c30);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)((long)&path_2.m_path.field_2 + 8))
    ;
    iutest::AssertionHelper::Fixed::~Fixed(&local_c30);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_a88);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)&iutest_ar_3.m_result);
  iutest::detail::iuFilePath::iuFilePath((iuFilePath *)&iutest_ar_6.m_result,"test");
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::RemoveExtension(&local_cc8,(iuFilePath *)&iutest_ar_6.m_result,"test")
  ;
  iutest::internal::backward::EqHelper<false>::Compare<char[5],iutest::detail::iuFilePath>
            ((AssertionResult *)local_ca8,(EqHelper<false> *)0x54fbf6,
             "path.RemoveExtension(\"test\")","test",(char (*) [5])&local_cc8,in_R9);
  iutest::detail::iuFilePath::~iuFilePath(&local_cc8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ca8);
  if (!bVar1) {
    memset(&local_e50,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_e50);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_ca8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_7.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xb8,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_7.m_result,&local_e50);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_7.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_e50);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_ca8);
  iutest::detail::AlwaysZero();
  iutest::detail::iuFilePath::RemoveExtension(&local_ec8,(iuFilePath *)&iutest_ar_6.m_result,"exe");
  iutest::internal::backward::EqHelper<false>::Compare<char[5],iutest::detail::iuFilePath>
            ((AssertionResult *)local_ea8,(EqHelper<false> *)0x54fbf6,
             "path.RemoveExtension(\"exe\")","test",(char (*) [5])&local_ec8,in_R9);
  iutest::detail::iuFilePath::~iuFilePath(&local_ec8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea8);
  if (!bVar1) {
    memset(&local_1050,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1050);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_ea8);
    iutest::AssertionHelper::AssertionHelper
              (&local_1080,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/filepath_tests.cpp"
               ,0xb9,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_1080,&local_1050);
    iutest::AssertionHelper::~AssertionHelper(&local_1080);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1050);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_ea8);
  iutest::detail::iuFilePath::~iuFilePath((iuFilePath *)&iutest_ar_6.m_result);
  return;
}

Assistant:

IUTEST(FilePath, RemoveExtension)
{
    {
        ::iutest::internal::FilePath path("test.exe");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveExtension("bin"));
        IUTEST_EXPECT_EQ("test", path.RemoveExtension("exe"));
#if !defined(IUTEST_USE_GTEST)
        IUTEST_EXPECT_EQ("test", path.RemoveExtension());
#endif
    }
    {
        ::iutest::internal::FilePath path("test.exe.bin");
        IUTEST_EXPECT_EQ("test.exe", path.RemoveExtension("bin"));
        IUTEST_EXPECT_EQ("test.exe.bin", path.RemoveExtension("exe"));
#if !defined(IUTEST_USE_GTEST)
        IUTEST_EXPECT_EQ("test.exe", path.RemoveExtension());
#endif
    }
    {
        ::iutest::internal::FilePath path("test");
        IUTEST_EXPECT_EQ("test", path.RemoveExtension("test"));
        IUTEST_EXPECT_EQ("test", path.RemoveExtension("exe"));
    }
}